

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.c
# Opt level: O2

void testAdjMatrixGraph(void)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  undefined8 uVar4;
  Vertices vertex;
  Edges pEVar5;
  MatrixGraph matrixGraph;
  ulong uVar6;
  int i;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int i_1;
  int_0_ *P;
  int_0_ *D;
  int_0_ *piVar10;
  undefined8 uStack_50;
  int aiStack_48 [2];
  long local_40;
  long local_38;
  
  uStack_50 = 0x107a44;
  puts("*****************************************************");
  uStack_50 = 0x107a50;
  puts(&DAT_0010dcbc);
  uStack_50 = 0x107a58;
  puts("*****************************************************");
  uStack_50 = 0x107a64;
  vertex = newVexTestCase(5);
  uStack_50 = 0x107a6f;
  pEVar5 = newEdgeTestCase(5);
  uStack_50 = 0x107a87;
  matrixGraph = createAdjacencyMatrix(vertex,pEVar5,5,5,DN);
  uStack_50 = 0x107a92;
  showMatrixGraph_AMG(matrixGraph);
  uStack_50 = 0x107a9d;
  pEVar5 = reAllocEdge(5,pEVar5);
  uStack_50 = 0x107aab;
  newEdgeForGraphVertex_AMG(matrixGraph,pEVar5,7);
  uStack_50 = 0x107ab3;
  showMatrixGraph_AMG(matrixGraph);
  uStack_50 = 0x107abf;
  puts(&DAT_0010de9c);
  uStack_50 = 0x107ac7;
  dfsTraversal_AMG(matrixGraph);
  uStack_50 = 0x107ad3;
  puts(&DAT_0010debb);
  uStack_50 = 0x107adb;
  bfsTraversal_AMG(matrixGraph);
  uStack_50 = 0x107ae3;
  numOfConnectedComponents_AMG(matrixGraph);
  uStack_50 = 0x107af3;
  printf(anon_var_dwarf_a55b);
  uStack_50 = 0x107aff;
  puts(&DAT_0010dd02);
  uStack_50 = 0x107b07;
  miniSpanTree_Prim(matrixGraph);
  uStack_50 = 0x107b13;
  puts(&DAT_0010dd29);
  uStack_50 = 0x107b1b;
  miniSpanTree_Kruskal(matrixGraph);
  uStack_50 = 0x107b27;
  puts(&DAT_0010dd52);
  lVar9 = -((ulong)(uint)matrixGraph->vexNum * 4 + 0xf & 0xfffffffffffffff0);
  *(undefined8 *)((long)aiStack_48 + lVar9 + -8) = 0x107b4c;
  shortPath_Dijkstra(matrixGraph,0,(int *)((long)aiStack_48 + lVar9));
  for (lVar7 = 0; lVar7 < matrixGraph->vexNum; lVar7 = lVar7 + 1) {
    cVar1 = *matrixGraph->vertex;
    cVar2 = matrixGraph->vertex[lVar7];
    *(undefined8 *)((long)aiStack_48 + lVar9 + -8) = 0x107b78;
    printf("%c -> %c : %d\n",(ulong)(uint)(int)cVar1,(ulong)(uint)(int)cVar2);
  }
  *(undefined8 *)((long)aiStack_48 + lVar9 + -8) = 0x107b89;
  puts(&DAT_0010dd76);
  uVar8 = (ulong)(uint)matrixGraph->vexNum;
  uVar6 = uVar8 * uVar8 * 4 + 0xf & 0xfffffffffffffff0;
  P = (int_0_ *)(((long)aiStack_48 + lVar9) - uVar6);
  D = P + -uVar6;
  *(undefined8 *)(D + -8) = 0x107bc0;
  shortestPath_Floyd(matrixGraph,P,D);
  *(undefined8 *)(D + -8) = 0x107bcc;
  puts(&DAT_0010dd97);
  local_38 = uVar8 << 2;
  lVar9 = 0;
  piVar10 = D;
  while (uVar6 = (ulong)matrixGraph->vexNum, lVar9 < (long)uVar6) {
    local_40 = lVar9;
    for (lVar9 = 0; lVar9 < (int)uVar6; lVar9 = lVar9 + 1) {
      if (*(int *)(piVar10 + lVar9 * 4) == 0x7fff) {
        *(undefined8 *)(D + -8) = 0x107c0e;
        printf(anon_var_dwarf_a5e6);
      }
      else {
        *(undefined8 *)(D + -8) = 0x107c1a;
        printf("%d\t");
      }
      uVar6 = (ulong)(uint)matrixGraph->vexNum;
    }
    *(undefined8 *)(D + -8) = 10;
    uVar4 = *(undefined8 *)(D + -8);
    *(undefined8 *)(D + -8) = 0x107c2a;
    putchar((int)uVar4);
    piVar10 = piVar10 + local_38;
    lVar9 = local_40 + 1;
  }
  *(undefined8 *)(D + -8) = 0x107c43;
  puts(&DAT_0010dda2);
  for (lVar9 = 0; uVar6 = (ulong)matrixGraph->vexNum, lVar9 < (long)uVar6; lVar9 = lVar9 + 1) {
    for (lVar7 = 0; lVar7 < (int)uVar6; lVar7 = lVar7 + 1) {
      uVar3 = *(uint *)(P + lVar7 * 4);
      *(undefined8 *)(D + -8) = 0x107c6e;
      printf("%d\t",(ulong)uVar3);
      uVar6 = (ulong)(uint)matrixGraph->vexNum;
    }
    *(undefined8 *)(D + -8) = 10;
    uVar4 = *(undefined8 *)(D + -8);
    *(undefined8 *)(D + -8) = 0x107c7e;
    putchar((int)uVar4);
    P = P + local_38;
  }
  *(undefined8 *)(D + -8) = 0x107c93;
  puts(anon_var_dwarf_603e + 0x43);
  return;
}

Assistant:

void testAdjMatrixGraph() {
    printf("*****************************************************\n");
    printf("*              邻接矩阵存储结构图测试例程              *\n");
    printf("*****************************************************\n");

    const int VERTEX_SIZE = 5;
    Vertices vertex = newVexTestCase(VERTEX_SIZE);

    // [a, b, c, d, e]
    Edges edge = newEdgeTestCase(VERTEX_SIZE);

    MatrixGraph matrix = createAdjacencyMatrix(vertex, edge, VERTEX_SIZE, VERTEX_SIZE, DN);
    showMatrixGraph_AMG(matrix);

    edge = reAllocEdge(VERTEX_SIZE, edge);

    newEdgeForGraphVertex_AMG(matrix, edge, VERTEX_SIZE + 2);
    showMatrixGraph_AMG(matrix);

    printf("深度优先遍历的结果：\n");
    dfsTraversal_AMG(matrix);

    printf("广度优先遍历的结果：\n");
    bfsTraversal_AMG(matrix);

    printf("连通分量的个数为：%d\n", numOfConnectedComponents_AMG(matrix));

    printf("Prime的算法计算最小生成树：\n");
    miniSpanTree_Prim(matrix);

    printf("Kruskal的算法计算最小生成树：\n");
    miniSpanTree_Kruskal(matrix);

    printf("Dijkstra算法计算最短路径：\n");
    int D[matrix->vexNum], V0 = 0;
    shortPath_Dijkstra(matrix, V0, D);
    for (int i = 0; i < matrix->vexNum; ++i)
        printf("%c -> %c : %d\n", matrix->vertex[V0], matrix->vertex[i], D[i]);

    printf("Floyd算法计算最短路径：\n");
    int P[matrix->vexNum][matrix->vexNum];
    int D_f[matrix->vexNum][matrix->vexNum];
    shortestPath_Floyd(matrix, P, D_f);
    printf("矩阵D：\n");
    for (int i = 0; i < matrix->vexNum; ++i) {
        for (int j = 0; j < matrix->vexNum; ++j)
            if (D_f[i][j] == UNFLAG_WEIGHT_GRAPH)
                printf("∞\t");
            else
                printf("%d\t", D_f[i][j]);
        printf("\n");
    }

    printf("矩阵P：\n");
    for (int i = 0; i < matrix->vexNum; ++i) {
        for (int j = 0; j < matrix->vexNum; ++j)
            printf("%d\t", P[i][j]);
        printf("\n");
    }
    puts("\n");
}